

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O0

void __thiscall ot::commissioner::ProxyClient::SendEmptyChanged(ProxyClient *this,Request *aRequest)

{
  int iVar1;
  Endpoint *pEVar2;
  Error local_68;
  Address local_30;
  Request *local_18;
  Request *aRequest_local;
  ProxyClient *this_local;
  
  local_18 = aRequest;
  aRequest_local = (Request *)this;
  pEVar2 = coap::Message::GetEndpoint(aRequest);
  (*pEVar2->_vptr_Endpoint[3])();
  ProxyEndpoint::SetPeerAddr(&this->mEndpoint,&local_30);
  Address::~Address(&local_30);
  pEVar2 = coap::Message::GetEndpoint(local_18);
  iVar1 = (*pEVar2->_vptr_Endpoint[4])();
  ProxyEndpoint::SetPeerPort(&this->mEndpoint,(uint16_t)iVar1);
  coap::Coap::SendEmptyChanged(&local_68,&this->mCoap,local_18);
  IgnoreError(&local_68);
  Error::~Error(&local_68);
  return;
}

Assistant:

void ProxyClient::SendEmptyChanged(const coap::Request &aRequest)
{
    mEndpoint.SetPeerAddr(aRequest.GetEndpoint()->GetPeerAddr());
    mEndpoint.SetPeerPort(aRequest.GetEndpoint()->GetPeerPort());

    IgnoreError(mCoap.SendEmptyChanged(aRequest));
}